

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O2

int EVP_sha256_final_with_secret_suffix
              (SHA256_CTX *ctx,uint8_t *out,uint8_t *in,size_t len,size_t max_len)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint8_t auVar6 [4];
  size_t j_1;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong __n;
  ulong uVar11;
  ulong uVar12;
  ulong __n_00;
  size_t i;
  ulong uVar13;
  byte abStack_110 [48];
  undefined8 uStack_e0;
  uint8_t length_bytes [4];
  uint32_t result [8];
  uint8_t block [64];
  
  iVar4 = 0;
  if (((max_len >> 0x3d == 0) && (ctx->Nh == 0)) &&
     (uVar5 = ctx->Nl, max_len * 8 + (ulong)uVar5 >> 0x20 == 0 && !CARRY8(max_len * 8,(ulong)uVar5))
     ) {
    uVar1 = ctx->num;
    uVar10 = len + uVar1 + 0x48 >> 6;
    uVar5 = uVar5 + (int)len * 8;
    auVar6 = (uint8_t  [4])
             (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000);
    length_bytes[0] = auVar6[0];
    length_bytes[1] = auVar6[1];
    length_bytes[2] = auVar6[2];
    length_bytes[3] = auVar6[3];
    block[0x30] = '\0';
    block[0x31] = '\0';
    block[0x32] = '\0';
    block[0x33] = '\0';
    block[0x34] = '\0';
    block[0x35] = '\0';
    block[0x36] = '\0';
    block[0x37] = '\0';
    block[0x38] = '\0';
    block[0x39] = '\0';
    block[0x3a] = '\0';
    block[0x3b] = '\0';
    block[0x3c] = '\0';
    block[0x3d] = '\0';
    block[0x3e] = '\0';
    block[0x3f] = '\0';
    block[0x20] = '\0';
    block[0x21] = '\0';
    block[0x22] = '\0';
    block[0x23] = '\0';
    block[0x24] = '\0';
    block[0x25] = '\0';
    block[0x26] = '\0';
    block[0x27] = '\0';
    block[0x28] = '\0';
    block[0x29] = '\0';
    block[0x2a] = '\0';
    block[0x2b] = '\0';
    block[0x2c] = '\0';
    block[0x2d] = '\0';
    block[0x2e] = '\0';
    block[0x2f] = '\0';
    block[0x10] = '\0';
    block[0x11] = '\0';
    block[0x12] = '\0';
    block[0x13] = '\0';
    block[0x14] = '\0';
    block[0x15] = '\0';
    block[0x16] = '\0';
    block[0x17] = '\0';
    block[0x18] = '\0';
    block[0x19] = '\0';
    block[0x1a] = '\0';
    block[0x1b] = '\0';
    block[0x1c] = '\0';
    block[0x1d] = '\0';
    block[0x1e] = '\0';
    block[0x1f] = '\0';
    block[0] = '\0';
    block[1] = '\0';
    block[2] = '\0';
    block[3] = '\0';
    block[4] = '\0';
    block[5] = '\0';
    block[6] = '\0';
    block[7] = '\0';
    block[8] = '\0';
    block[9] = '\0';
    block[10] = '\0';
    block[0xb] = '\0';
    block[0xc] = '\0';
    block[0xd] = '\0';
    block[0xe] = '\0';
    block[0xf] = '\0';
    result[4] = 0;
    result[5] = 0;
    result[6] = 0;
    result[7] = 0;
    result[0] = 0;
    result[1] = 0;
    result[2] = 0;
    result[3] = 0;
    uVar12 = 0;
    for (uVar13 = 0; uVar13 != uVar1 + max_len + 0x48 >> 6; uVar13 = uVar13 + 1) {
      if ((uVar13 == 0) && (__n_00 = (ulong)ctx->num, __n_00 != 0)) {
        uStack_e0 = 0x174bbf;
        memcpy(block,ctx->data,__n_00);
      }
      else {
        __n_00 = 0;
      }
      uVar7 = max_len - uVar12;
      uVar11 = uVar12;
      uVar9 = __n_00;
      if (uVar12 <= max_len && uVar7 != 0) {
        __n = 0x40 - __n_00;
        if (uVar7 <= 0x40 - __n_00) {
          __n = uVar7;
        }
        if (__n != 0) {
          uStack_e0 = 0x174bef;
          memcpy(block + __n_00,in + uVar12,__n);
        }
      }
      for (; uVar9 < 0x40; uVar9 = uVar9 + 1) {
        bVar3 = (byte)(uVar11 >> 0x38);
        bVar2 = (byte)((len ^ uVar11) >> 0x38);
        block[uVar9] = (byte)((len ^ uVar11) - 1 >> 0x38) & ~bVar2 & 0x80 |
                       (char)(((byte)(uVar11 - len >> 0x38) ^ bVar3 | bVar2) ^ bVar3) >> 7 &
                       block[uVar9];
        uVar11 = uVar11 + 1;
      }
      uVar11 = (uVar13 ^ uVar10 - 1) - 1 & -uVar10;
      for (lVar8 = 0x3c; lVar8 != 0x40; lVar8 = lVar8 + 1) {
        block[lVar8] = block[lVar8] | abStack_110[lVar8] & (byte)((long)uVar11 >> 0x3f);
      }
      uStack_e0 = 0x174c78;
      SHA256_Transform((SHA256_CTX *)ctx,block);
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        result[lVar8] = result[lVar8] | ctx->h[lVar8] & (uint)((long)uVar11 >> 0x3f);
      }
      uVar12 = (uVar12 + 0x40) - __n_00;
    }
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      uVar5 = result[lVar8];
      *(uint *)(out + lVar8 * 4) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int EVP_sha256_final_with_secret_suffix(SHA256_CTX *ctx,
                                        uint8_t out[SHA256_DIGEST_LENGTH],
                                        const uint8_t *in, size_t len,
                                        size_t max_len) {
  // Bound the input length so |total_bits| below fits in four bytes. This is
  // redundant with TLS record size limits. This also ensures |input_idx| below
  // does not overflow.
  size_t max_len_bits = max_len << 3;
  if (ctx->Nh != 0 ||
      (max_len_bits >> 3) != max_len ||  // Overflow
      ctx->Nl + max_len_bits < max_len_bits ||
      ctx->Nl + max_len_bits > UINT32_MAX) {
    return 0;
  }

  // We need to hash the following into |ctx|:
  //
  // - ctx->data[:ctx->num]
  // - in[:len]
  // - A 0x80 byte
  // - However many zero bytes are needed to pad up to a block.
  // - Eight bytes of length.
  size_t num_blocks = (ctx->num + len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;
  size_t last_block = num_blocks - 1;
  size_t max_blocks = (ctx->num + max_len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;

  // The bounds above imply |total_bits| fits in four bytes.
  size_t total_bits = ctx->Nl + (len << 3);
  uint8_t length_bytes[4];
  length_bytes[0] = (uint8_t)(total_bits >> 24);
  length_bytes[1] = (uint8_t)(total_bits >> 16);
  length_bytes[2] = (uint8_t)(total_bits >> 8);
  length_bytes[3] = (uint8_t)total_bits;

  // We now construct and process each expected block in constant-time.
  uint8_t block[SHA256_CBLOCK] = {0};
  uint32_t result[8] = {0};
  // input_idx is the index into |in| corresponding to the current block.
  // However, we allow this index to overflow beyond |max_len|, to simplify the
  // 0x80 byte.
  size_t input_idx = 0;
  for (size_t i = 0; i < max_blocks; i++) {
    // Fill |block| with data from the partial block in |ctx| and |in|. We copy
    // as if we were hashing up to |max_len| and then zero the excess later.
    size_t block_start = 0;
    if (i == 0) {
      OPENSSL_memcpy(block, ctx->data, ctx->num);
      block_start = ctx->num;
    }
    if (input_idx < max_len) {
      size_t to_copy = SHA256_CBLOCK - block_start;
      if (to_copy > max_len - input_idx) {
        to_copy = max_len - input_idx;
      }
      OPENSSL_memcpy(block + block_start, in + input_idx, to_copy);
    }

    // Zero any bytes beyond |len| and add the 0x80 byte.
    for (size_t j = block_start; j < SHA256_CBLOCK; j++) {
      // input[idx] corresponds to block[j].
      size_t idx = input_idx + j - block_start;
      // The barriers on |len| are not strictly necessary. However, without
      // them, GCC compiles this code by incorporating |len| into the loop
      // counter and subtracting it out later. This is still constant-time, but
      // it frustrates attempts to validate this.
      uint8_t is_in_bounds = constant_time_lt_8(idx, value_barrier_w(len));
      uint8_t is_padding_byte = constant_time_eq_8(idx, value_barrier_w(len));
      block[j] &= is_in_bounds;
      block[j] |= 0x80 & is_padding_byte;
    }

    input_idx += SHA256_CBLOCK - block_start;

    // Fill in the length if this is the last block.
    crypto_word_t is_last_block = constant_time_eq_w(i, last_block);
    for (size_t j = 0; j < 4; j++) {
      block[SHA256_CBLOCK - 4 + j] |= is_last_block & length_bytes[j];
    }

    // Process the block and save the hash state if it is the final value.
    SHA256_Transform(ctx, block);
    for (size_t j = 0; j < 8; j++) {
      result[j] |= is_last_block & ctx->h[j];
    }
  }

  // Write the output.
  for (size_t i = 0; i < 8; i++) {
    CRYPTO_store_u32_be(out + 4 * i, result[i]);
  }
  return 1;
}